

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a28a9::BNTest_RSAZABI_Test::TestBody(BNTest_RSAZABI_Test *this)

{
  Type_conflict args_3;
  int iVar1;
  char *in_R9;
  UniquePtr<BN_MONT_CTX> mont;
  UniquePtr<BIGNUM> n;
  AssertionResult gtest_ar_;
  BN_ULONG norm [16];
  BN_ULONG n_norm [16];
  BN_ULONG rsaz3 [40];
  BN_ULONG rsaz1 [40];
  BN_ULONG n_rsaz [40];
  BN_ULONG rsaz2 [40];
  BN_ULONG table [576];
  AssertHelper local_18d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18c8;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_18c0;
  AssertHelper local_18b8;
  string local_18b0;
  internal local_1890 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1888;
  unsigned_long local_1880 [16];
  BN_ULONG local_1800 [16];
  unsigned_long local_1780 [40];
  unsigned_long local_1640 [40];
  unsigned_long local_1500 [40];
  unsigned_long local_13c0 [40];
  unsigned_long local_1280 [586];
  
  iVar1 = CRYPTO_is_AVX2_capable();
  if (iVar1 == 0) {
    return;
  }
  memset(local_1280,0,0x1200);
  local_1880[0] = 0x4242424242424242;
  local_1880[1] = 0x4242424242424242;
  local_1880[2] = 0x4242424242424242;
  local_1880[3] = 0x4242424242424242;
  local_1880[4] = 0x4242424242424242;
  local_1880[5] = 0x4242424242424242;
  local_1880[6] = 0x4242424242424242;
  local_1880[7] = 0x4242424242424242;
  local_1880[8] = 0x4242424242424242;
  local_1880[9] = 0x4242424242424242;
  local_1880[10] = 0x4242424242424242;
  local_1880[0xb] = 0x4242424242424242;
  local_1880[0xc] = 0x4242424242424242;
  local_1880[0xd] = 0x4242424242424242;
  local_1880[0xe] = 0x4242424242424242;
  local_1880[0xf] = 0x4242424242424242;
  local_1800[0] = 0x9999999999999999;
  local_1800[1] = 0x9999999999999999;
  local_1800[2] = 0x9999999999999999;
  local_1800[3] = 0x9999999999999999;
  local_1800[4] = 0x9999999999999999;
  local_1800[5] = 0x9999999999999999;
  local_1800[6] = 0x9999999999999999;
  local_1800[7] = 0x9999999999999999;
  local_1800[8] = 0x9999999999999999;
  local_1800[9] = 0x9999999999999999;
  local_1800[10] = 0x9999999999999999;
  local_1800[0xb] = 0x9999999999999999;
  local_1800[0xc] = 0x9999999999999999;
  local_1800[0xd] = 0x9999999999999999;
  local_1800[0xe] = 0x9999999999999999;
  local_1800[0xf] = 0x9999999999999999;
  local_18c0._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  local_1888._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_1890[0] =
       (internal)
       ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        local_18c0._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bignum_st_*,_false>)0x0);
  if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
      local_18c0._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_18c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_18b0,local_1890,(AssertionResult *)0x562cc8,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xb7d,local_18b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_18d0,(Message *)&local_18c8);
    testing::internal::AssertHelper::~AssertHelper(&local_18d0);
    std::__cxx11::string::~string((string *)&local_18b0);
    if ((BN_MONT_CTX *)local_18c8._M_head_impl != (BN_MONT_CTX *)0x0) {
      (**(code **)(*(long *)local_18c8._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1888);
    iVar1 = bn_set_words((BIGNUM *)
                         local_18c0._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,local_1800,0x10);
    local_1888._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    local_1890[0] = (internal)(iVar1 != 0);
    if ((bool)local_1890[0]) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1888);
      local_18c8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           BN_MONT_CTX_new_for_modulus
                     ((BIGNUM *)
                      local_18c0._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
      local_1888._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      local_1890[0] = (internal)((BN_MONT_CTX *)local_18c8._M_head_impl != (BN_MONT_CTX *)0x0);
      if ((BN_MONT_CTX *)local_18c8._M_head_impl == (BN_MONT_CTX *)0x0) {
        testing::Message::Message((Message *)&local_18d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_18b0,local_1890,(AssertionResult *)0x4db2f4,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_18b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb81,local_18b0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_18b8,(Message *)&local_18d0);
        testing::internal::AssertHelper::~AssertHelper(&local_18b8);
        std::__cxx11::string::~string((string *)&local_18b0);
        if (local_18d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_18d0.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1888);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1888);
        args_3 = *(Type_conflict *)(local_18c8._M_head_impl + 0x30);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_norm2red_avx2, rsaz1, norm",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb84,true,rsaz_1024_norm2red_avx2,local_1640,local_1880);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_norm2red_avx2, n_rsaz, n_norm",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb85,true,rsaz_1024_norm2red_avx2,local_1500,local_1800);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                  ("rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb86,true,rsaz_1024_sqr_avx2,local_13c0,local_1640,local_1500,args_3,1);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                  ("rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb87,true,rsaz_1024_sqr_avx2,local_1780,local_13c0,local_1500,args_3,4);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long>
                  ("rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb88,true,rsaz_1024_mul_avx2,local_1780,local_1640,local_13c0,local_1500,args_3
                  );
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                  ("rsaz_1024_scatter5_avx2, table, rsaz3, 7",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb89,true,rsaz_1024_scatter5_avx2,local_1280,local_1780,7);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                  ("rsaz_1024_gather5_avx2, rsaz1, table, 7",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb8a,true,rsaz_1024_gather5_avx2,local_1640,local_1280,7);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_red2norm_avx2, norm, rsaz1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb8b,true,rsaz_1024_red2norm_avx2,local_1880,local_1640);
      }
      std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_18c8);
      goto LAB_0028ebbc;
    }
    testing::Message::Message((Message *)&local_18c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_18b0,local_1890,(AssertionResult *)"bn_set_words(n.get(), n_norm, 16)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xb7e,local_18b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_18d0,(Message *)&local_18c8);
    testing::internal::AssertHelper::~AssertHelper(&local_18d0);
    std::__cxx11::string::~string((string *)&local_18b0);
    if ((BN_MONT_CTX *)local_18c8._M_head_impl != (BN_MONT_CTX *)0x0) {
      (**(code **)(*(long *)local_18c8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1888);
LAB_0028ebbc:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_18c0);
  return;
}

Assistant:

TEST_F(BNTest, RSAZABI) {
  if (!rsaz_avx2_capable()) {
    return;
  }

  alignas(64) BN_ULONG table[32 * 18] = {0};
  alignas(64) BN_ULONG rsaz1[40], rsaz2[40], rsaz3[40], n_rsaz[40];
  BN_ULONG norm[16], n_norm[16];

  OPENSSL_memset(norm, 0x42, sizeof(norm));
  OPENSSL_memset(n_norm, 0x99, sizeof(n_norm));

  bssl::UniquePtr<BIGNUM> n(BN_new());
  ASSERT_TRUE(n);
  ASSERT_TRUE(bn_set_words(n.get(), n_norm, 16));
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(n.get(), nullptr));
  ASSERT_TRUE(mont);
  const BN_ULONG k = mont->n0[0];

  CHECK_ABI(rsaz_1024_norm2red_avx2, rsaz1, norm);
  CHECK_ABI(rsaz_1024_norm2red_avx2, n_rsaz, n_norm);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4);
  CHECK_ABI(rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k);
  CHECK_ABI(rsaz_1024_scatter5_avx2, table, rsaz3, 7);
  CHECK_ABI(rsaz_1024_gather5_avx2, rsaz1, table, 7);
  CHECK_ABI(rsaz_1024_red2norm_avx2, norm, rsaz1);
}